

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O2

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::continueHandshake(TlsCryptographOpenSSL *this)

{
  QSslSocketPrivate *pQVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  QArrayDataPointer<char> *this_00;
  long in_FS_OFFSET;
  NPNContext NVar8;
  uint proto_len;
  uchar *proto;
  char *pcStack_58;
  qsizetype local_50;
  EVP_PKEY *key;
  char *pcStack_40;
  long local_38;
  QSslConfiguration local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar6 = (long *)QSslSocketPrivate::plainTcpSocket();
  iVar4 = QSslSocketPrivate::tlsMode();
  lVar7 = QSslSocketPrivate::maxReadBufferSize();
  if (lVar7 != 0) {
    (**(code **)(*plVar6 + 0x108))(plVar6,lVar7);
  }
  iVar5 = q_SSL_session_reused(this->ssl);
  if (iVar5 != 0) {
    QTlsBackend::setPeerSessionShared(this->d,true);
  }
  QSslSocket::sslConfiguration();
  cVar2 = QSslConfiguration::testSslOption((SslOption)&local_30);
  if (cVar2 == '\0') {
    bVar3 = QSslContext::cacheSession
                      ((this->sslContextPointer).
                       super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->ssl)
    ;
    if (bVar3) {
      cVar2 = QSslConfiguration::testSslOption((SslOption)&local_30);
      if (cVar2 == '\0') {
        QSslContext::sessionASN1
                  ((QByteArray *)&key,
                   (this->sslContextPointer).
                   super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        lVar7 = local_38;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&key);
        if (lVar7 != 0) {
          pQVar1 = this->d;
          QSslContext::sessionASN1
                    ((QByteArray *)&key,
                     (this->sslContextPointer).
                     super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          QTlsBackend::setSessionAsn1(pQVar1,(QByteArray *)&key);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&key);
        }
        pQVar1 = this->d;
        iVar5 = QSslContext::sessionTicketLifeTimeHint
                          ((this->sslContextPointer).
                           super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        QTlsBackend::setSessionLifetimeHint(pQVar1,iVar5);
      }
    }
    else {
      std::__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->sslContextPointer).
                  super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  pQVar1 = this->d;
  NVar8 = QSslContext::npnContext
                    ((this->sslContextPointer).
                     super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QTlsBackend::setAlpnStatus(pQVar1,NVar8.status);
  NVar8 = QSslContext::npnContext
                    ((this->sslContextPointer).
                     super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (NVar8.status == NextProtocolNegotiationUnsupported) {
    key = (EVP_PKEY *)0x0;
    this_00 = (QArrayDataPointer<char> *)&proto;
    proto = (uchar *)0x0;
    pcStack_58 = (char *)0x0;
    pcStack_40 = "http/1.1";
    local_50 = 0;
    local_38 = 8;
    QTlsBackend::setNegotiatedProtocol(this->d,(QByteArray *)&key);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&key);
  }
  else {
    proto = (uchar *)0x0;
    proto_len = 0;
    q_SSL_get0_alpn_selected(this->ssl,&proto,&proto_len);
    if (iVar4 == 1 && proto_len != 0) {
      QTlsBackend::setAlpnStatus(this->d,NextProtocolNegotiationNegotiated);
    }
    if ((proto_len == 0) &&
       (q_SSL_get0_next_proto_negotiated(this->ssl,&proto,&proto_len), proto_len == 0)) {
      this_00 = (QArrayDataPointer<char> *)&key;
      key = (EVP_PKEY *)0x0;
      pcStack_40 = (char *)0x0;
      local_38 = 0;
      QTlsBackend::setNegotiatedProtocol(this->d,(QByteArray *)this_00);
    }
    else {
      pQVar1 = this->d;
      this_00 = (QArrayDataPointer<char> *)&key;
      QByteArray::QByteArray((QByteArray *)this_00,(char *)proto,(ulong)proto_len);
      QTlsBackend::setNegotiatedProtocol(pQVar1,(QByteArray *)this_00);
    }
  }
  QArrayDataPointer<char>::~QArrayDataPointer(this_00);
  if (iVar4 == 1) {
    key = (EVP_PKEY *)0xaaaaaaaaaaaaaaaa;
    lVar7 = q_SSL_ctrl(this->ssl,0x6d,0,&key);
    if (lVar7 != 0) {
      pQVar1 = this->d;
      QSslKey::QSslKey((QSslKey *)&proto,key,PublicKey);
      QTlsBackend::setEphemeralKey(pQVar1,(QSslKey *)&proto);
      QSslKey::~QSslKey((QSslKey *)&proto);
    }
  }
  QSslSocketPrivate::setEncrypted(SUB81(this->d,0));
  QSslSocket::encrypted();
  cVar2 = QSslSocketPrivate::isAutoStartingHandshake();
  if ((cVar2 != '\0') && (cVar2 = QSslSocketPrivate::isPendingClose(), cVar2 != '\0')) {
    QSslSocketPrivate::setPendingClose(SUB81(this->d,0));
    (**(code **)(*(long *)this->q + 0x100))();
  }
  QSslConfiguration::~QSslConfiguration(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TlsCryptographOpenSSL::continueHandshake()
{
    Q_ASSERT(q);
    Q_ASSERT(d);

    auto *plainSocket = d->plainTcpSocket();
    Q_ASSERT(plainSocket);

    const auto mode = d->tlsMode();

    // if we have a max read buffer size, reset the plain socket's to match
    if (const auto maxSize = d->maxReadBufferSize())
        plainSocket->setReadBufferSize(maxSize);

    if (q_SSL_session_reused(ssl))
        QTlsBackend::setPeerSessionShared(d, true);

#ifdef QT_DECRYPT_SSL_TRAFFIC
    if (q_SSL_get_session(ssl)) {
        size_t master_key_len = q_SSL_SESSION_get_master_key(q_SSL_get_session(ssl), nullptr, 0);
        size_t client_random_len = q_SSL_get_client_random(ssl, nullptr, 0);
        QByteArray masterKey(int(master_key_len), Qt::Uninitialized); // Will not overflow
        QByteArray clientRandom(int(client_random_len), Qt::Uninitialized); // Will not overflow

        q_SSL_SESSION_get_master_key(q_SSL_get_session(ssl),
                                     reinterpret_cast<unsigned char*>(masterKey.data()),
                                     masterKey.size());
        q_SSL_get_client_random(ssl, reinterpret_cast<unsigned char *>(clientRandom.data()),
                                clientRandom.size());

        QByteArray debugLineClientRandom("CLIENT_RANDOM ");
        debugLineClientRandom.append(clientRandom.toHex().toUpper());
        debugLineClientRandom.append(" ");
        debugLineClientRandom.append(masterKey.toHex().toUpper());
        debugLineClientRandom.append("\n");

        QString sslKeyFile = QDir::tempPath() + "/qt-ssl-keys"_L1;
        QFile file(sslKeyFile);
        if (!file.open(QIODevice::Append))
            qCWarning(lcTlsBackend) << "could not open file" << sslKeyFile << "for appending";
        if (!file.write(debugLineClientRandom))
            qCWarning(lcTlsBackend) << "could not write to file" << sslKeyFile;
        file.close();
    } else {
        qCWarning(lcTlsBackend, "could not decrypt SSL traffic");
    }
#endif // QT_DECRYPT_SSL_TRAFFIC

    const auto &configuration = q->sslConfiguration();
    // Cache this SSL session inside the QSslContext
    if (!(configuration.testSslOption(QSsl::SslOptionDisableSessionSharing))) {
        if (!sslContextPointer->cacheSession(ssl)) {
            sslContextPointer.reset(); // we could not cache the session
        } else {
            // Cache the session for permanent usage as well
            if (!(configuration.testSslOption(QSsl::SslOptionDisableSessionPersistence))) {
                if (!sslContextPointer->sessionASN1().isEmpty())
                    QTlsBackend::setSessionAsn1(d, sslContextPointer->sessionASN1());
                QTlsBackend::setSessionLifetimeHint(d, sslContextPointer->sessionTicketLifeTimeHint());
            }
        }
    }

#if !defined(OPENSSL_NO_NEXTPROTONEG)

    QTlsBackend::setAlpnStatus(d, sslContextPointer->npnContext().status);
    if (sslContextPointer->npnContext().status == QSslConfiguration::NextProtocolNegotiationUnsupported) {
        // we could not agree -> be conservative and use HTTP/1.1
        // T.P.: I have to admit, this is a really strange notion of 'conservative',
        // given the protocol-neutral nature of ALPN/NPN.
        QTlsBackend::setNegotiatedProtocol(d, QByteArrayLiteral("http/1.1"));
    } else {
        const unsigned char *proto = nullptr;
        unsigned int proto_len = 0;

        q_SSL_get0_alpn_selected(ssl, &proto, &proto_len);
        if (proto_len && mode == QSslSocket::SslClientMode) {
            // Client does not have a callback that sets it ...
            QTlsBackend::setAlpnStatus(d, QSslConfiguration::NextProtocolNegotiationNegotiated);
        }

        if (!proto_len) { // Test if NPN was more lucky ...
            q_SSL_get0_next_proto_negotiated(ssl, &proto, &proto_len);
        }

        if (proto_len)
            QTlsBackend::setNegotiatedProtocol(d, QByteArray(reinterpret_cast<const char *>(proto), proto_len));
        else
            QTlsBackend::setNegotiatedProtocol(d,{});
    }
#endif // !defined(OPENSSL_NO_NEXTPROTONEG)

    if (mode == QSslSocket::SslClientMode) {
        EVP_PKEY *key;
        if (q_SSL_get_server_tmp_key(ssl, &key))
            QTlsBackend::setEphemeralKey(d, QSslKey(key, QSsl::PublicKey));
    }

    d->setEncrypted(true);
    emit q->encrypted();
    if (d->isAutoStartingHandshake() && d->isPendingClose()) {
        d->setPendingClose(false);
        q->disconnectFromHost();
    }
}